

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_error.hpp
# Opt level: O2

string * __thiscall
jsoncons::cbor::cbor_error_category_impl::message_abi_cxx11_
          (string *__return_storage_ptr__,cbor_error_category_impl *this,int ev)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(ev) {
  case 1:
    __s = "Unexpected end of file";
    __a = &local_9;
    break;
  case 2:
    __s = "Source error";
    __a = &local_a;
    break;
  case 3:
    __s = "Invalid decimal fraction";
    __a = &local_b;
    break;
  case 4:
    __s = "Invalid bigfloat";
    __a = &local_c;
    break;
  case 5:
    __s = "Illegal UTF-8 encoding in text string";
    __a = &local_d;
    break;
  case 6:
    __s = "Too many items were added to a CBOR map or array of known length";
    __a = &local_e;
    break;
  case 7:
    __s = "Too few items were added to a CBOR map or array of known length";
    __a = &local_f;
    break;
  case 8:
    __s = "Number exceeds implementation limits";
    __a = &local_10;
    break;
  case 9:
    __s = "stringref exceeds stringref map size";
    __a = &local_11;
    break;
  case 10:
    __s = "Data item nesting exceeds limit in options";
    __a = &local_12;
    break;
  case 0xb:
    __s = "An unknown type was found in the stream";
    __a = &local_13;
    break;
  case 0xc:
    __s = "An illegal type was found while parsing an indefinite length string";
    __a = &local_14;
    break;
  default:
    __s = "Unknown CBOR parser error";
    __a = &local_15;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string message(int ev) const override
    {
        switch (static_cast<cbor_errc>(ev))
        {
            case cbor_errc::unexpected_eof:
                return "Unexpected end of file";
            case cbor_errc::source_error:
                return "Source error";
            case cbor_errc::invalid_decimal_fraction:
                return "Invalid decimal fraction";
            case cbor_errc::invalid_bigfloat:
                return "Invalid bigfloat";
            case cbor_errc::invalid_utf8_text_string:
                return "Illegal UTF-8 encoding in text string";
            case cbor_errc::too_many_items:
                return "Too many items were added to a CBOR map or array of known length";
            case cbor_errc::too_few_items:
                return "Too few items were added to a CBOR map or array of known length";
            case cbor_errc::number_too_large:
                return "Number exceeds implementation limits";
            case cbor_errc::stringref_too_large:
                return "stringref exceeds stringref map size";
            case cbor_errc::max_nesting_depth_exceeded:
                return "Data item nesting exceeds limit in options";
            case cbor_errc::unknown_type:
                return "An unknown type was found in the stream";
            case cbor_errc::illegal_chunked_string:
                return "An illegal type was found while parsing an indefinite length string";
            default:
                return "Unknown CBOR parser error";
        }
    }